

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(string *importUnitsName)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar4;
  ImporterPtr i;
  UnitsPtr u5;
  UnitsPtr u4;
  AssertHelper local_d0 [8];
  Message local_c8 [8];
  ModelPtr unitsModel;
  ImportSourcePtr import;
  ModelPtr model;
  VariablePtr v;
  ComponentPtr c;
  UnitsPtr u3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"Units_Database",(allocator<char> *)&u4);
  libcellml::Model::create((string *)&unitsModel);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"main_model",(allocator<char> *)&u4);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"fmol",(allocator<char> *)&u4);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"mole",(allocator<char> *)&u3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&u4,"femto",(allocator<char> *)&u5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&u2,"",(allocator<char> *)&import);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&i,1.0,1.0,(string *)&u4);
  std::__cxx11::string::~string((string *)&u2);
  std::__cxx11::string::~string((string *)&u4);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"per_fmol",(allocator<char> *)&u4)
  ;
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"fmol",(allocator<char> *)&u3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&u4,"",(allocator<char> *)&u5);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             -1.0,(string *)&i);
  std::__cxx11::string::~string((string *)&u4);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"per_sec",(allocator<char> *)&u4);
  libcellml::Units::create((string *)&u3);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"second",(allocator<char> *)&u5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&u4,"",(allocator<char> *)&import);
  libcellml::Units::addUnit
            ((string *)u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             -1.0,(string *)&i);
  std::__cxx11::string::~string((string *)&u4);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"per_sec_fmol",(allocator<char> *)&u5);
  libcellml::Units::create((string *)&u4);
  std::__cxx11::string::~string((string *)&i);
  peVar1 = u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"per_sec",(allocator<char> *)&u5);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"per_fmol",(allocator<char> *)&u5)
  ;
  libcellml::Units::addUnit
            ((string *)u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&i);
  libcellml::Units::create((string *)&u5);
  libcellml::Model::addUnits
            ((shared_ptr *)
             unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  peVar2 = import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"I_am_a_url",(allocator<char> *)&c);
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string((string *)&i);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"env",(allocator<char> *)&v);
  libcellml::Component::create((string *)&c);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"v",(allocator<char> *)&gtest_ar_)
  ;
  libcellml::Variable::create((string *)&v);
  std::__cxx11::string::~string((string *)&i);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"per_sec_fmol",(allocator<char> *)&gtest_ar_);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)&i);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar3 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message(local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&i,&gtest_ar_.success_,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xb5b,(char *)i.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    testing::internal::AssertHelper::operator=(local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    std::__cxx11::string::~string((string *)&i);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::create(SUB81(&i,0));
  libcellml::Importer::flattenModel((shared_ptr *)importUnitsName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importUnitsName;
  return (ModelPtr)MVar4.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(const std::string &importUnitsName)
{
    libcellml::ModelPtr unitsModel = libcellml::Model::create("Units_Database");
    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr u1 = libcellml::Units::create("fmol");
    u1->addUnit("mole", "femto");
    libcellml::UnitsPtr u2 = libcellml::Units::create("per_fmol");
    u2->addUnit("fmol", -1.0);
    libcellml::UnitsPtr u3 = libcellml::Units::create("per_sec");
    u3->addUnit("second", -1.0);
    libcellml::UnitsPtr u4 = libcellml::Units::create("per_sec_fmol");
    u4->addUnit("per_sec");
    u4->addUnit("per_fmol");
    libcellml::UnitsPtr u5 = libcellml::Units::create(importUnitsName);

    unitsModel->addUnits(u1);
    unitsModel->addUnits(u2);
    unitsModel->addUnits(u3);
    unitsModel->addUnits(u4);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(unitsModel);

    libcellml::ComponentPtr c = libcellml::Component::create("env");
    libcellml::VariablePtr v = libcellml::Variable::create("v");

    u5->setImportSource(import);
    u5->setImportReference("per_sec_fmol");

    v->setUnits(u5);
    c->addVariable(v);
    model->addUnits(u5);
    model->addComponent(c);

    EXPECT_FALSE(model->hasUnresolvedImports());

    libcellml::ImporterPtr i = libcellml::Importer::create();

    return i->flattenModel(model);
}